

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

TextureCubeView *
tcu::getEffectiveTView
          (TextureCubeView *__return_storage_ptr__,TextureCubeView *src,
          vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *storage
          ,Sampler *sampler)

{
  CubeFace CVar1;
  int iVar2;
  int iVar3;
  ConstPixelBufferAccess *baseAccess;
  reference __dest;
  ConstPixelBufferAccess local_88;
  int local_60;
  CubeFace local_5c;
  int levelNdx;
  int faceNdx;
  ConstPixelBufferAccess *storagePtrs [6];
  Sampler *sampler_local;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *storage_local;
  TextureCubeView *src_local;
  
  iVar2 = TextureCubeView::getNumLevels(src);
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
            (storage,(long)(iVar2 * 6));
  TextureCubeView::getNumLevels(src);
  _levelNdx = std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
              ::operator[](storage,0);
  iVar2 = TextureCubeView::getNumLevels(src);
  storagePtrs[0] =
       std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
       operator[](storage,(long)iVar2);
  iVar2 = TextureCubeView::getNumLevels(src);
  storagePtrs[1] =
       std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
       operator[](storage,(long)(iVar2 << 1));
  iVar2 = TextureCubeView::getNumLevels(src);
  storagePtrs[2] =
       std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
       operator[](storage,(long)(iVar2 * 3));
  iVar2 = TextureCubeView::getNumLevels(src);
  storagePtrs[3] =
       std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
       operator[](storage,(long)(iVar2 << 2));
  iVar2 = TextureCubeView::getNumLevels(src);
  storagePtrs[4] =
       std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
       operator[](storage,(long)(iVar2 * 5));
  iVar2 = TextureCubeView::getNumLevels(src);
  TextureCubeView::TextureCubeView
            (__return_storage_ptr__,iVar2,(ConstPixelBufferAccess *(*) [6])&levelNdx);
  for (local_5c = CUBEFACE_NEGATIVE_X; (int)local_5c < 6; local_5c = local_5c + CUBEFACE_POSITIVE_X)
  {
    local_60 = 0;
    while( true ) {
      iVar2 = local_60;
      iVar3 = TextureCubeView::getNumLevels(src);
      if (iVar3 <= iVar2) break;
      baseAccess = TextureCubeView::getLevelFace(src,local_60,local_5c);
      getEffectiveDepthStencilAccess(&local_88,baseAccess,sampler->depthStencilMode);
      CVar1 = local_5c;
      iVar2 = TextureCubeView::getNumLevels(src);
      __dest = std::
               vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
               operator[](storage,(long)(int)(CVar1 * iVar2 + local_60));
      memcpy(__dest,&local_88,0x28);
      local_60 = local_60 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TextureCubeView getEffectiveTView (const tcu::TextureCubeView& src, std::vector<tcu::ConstPixelBufferAccess>& storage, const tcu::Sampler& sampler)
{
	storage.resize(tcu::CUBEFACE_LAST * src.getNumLevels());

	const tcu::ConstPixelBufferAccess* storagePtrs[tcu::CUBEFACE_LAST] =
	{
		&storage[0 * src.getNumLevels()],
		&storage[1 * src.getNumLevels()],
		&storage[2 * src.getNumLevels()],
		&storage[3 * src.getNumLevels()],
		&storage[4 * src.getNumLevels()],
		&storage[5 * src.getNumLevels()],
	};

	tcu::TextureCubeView view = tcu::TextureCubeView(src.getNumLevels(), storagePtrs);

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; ++faceNdx)
	for (int levelNdx = 0; levelNdx < src.getNumLevels(); ++levelNdx)
		storage[faceNdx * src.getNumLevels() + levelNdx] = tcu::getEffectiveDepthStencilAccess(src.getLevelFace(levelNdx, (tcu::CubeFace)faceNdx), sampler.depthStencilMode);

	return view;
}